

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  GenericTypeHandler<google::protobuf::Message> *this_00;
  LogMessage *other;
  GenericTypeHandler<google::protobuf::Message> *from;
  int iVar3;
  Message *to;
  LogFinisher local_49;
  LogMessage local_48;
  
  iVar3 = this->current_size_;
  if (iVar3 < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x714);
    other = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
    iVar3 = this->current_size_;
  }
  pRVar2 = this->rep_;
  this->current_size_ = iVar3 + -1;
  this_00 = (GenericTypeHandler<google::protobuf::Message> *)pRVar2->elements[(long)iVar3 + -1];
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  if (iVar3 < iVar1) {
    pRVar2->elements[(long)iVar3 + -1] = pRVar2->elements[(long)iVar1 + -1];
  }
  from = this_00;
  if (this->arena_ != (Arena *)0x0) {
    from = (GenericTypeHandler<google::protobuf::Message> *)
           GenericTypeHandler<google::protobuf::Message>::NewFromPrototype
                     ((Message *)this_00,(Arena *)0x0);
    GenericTypeHandler<google::protobuf::Message>::Merge(this_00,(Message *)from,to);
  }
  return (Type *)from;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::ReleaseLastInternal(google::protobuf::internal::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArenaNoVirtual();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}